

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O1

rgba_vec_t *
sfc::unpack_native_colors(rgba_vec_t *__return_storage_ptr__,byte_vec_t *colors,Mode mode)

{
  iterator iVar1;
  bool bVar2;
  pointer puVar3;
  runtime_error *this;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint i;
  uint uVar8;
  long lVar9;
  rgba_t nc;
  uint local_2c;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(mode) {
  case snes:
  case snes_mode7:
  case gbc:
  case gba:
  case gba_affine:
    if ((*(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
      goto LAB_001480ce;
    }
    puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      uVar8 = 2;
      uVar4 = 0;
      do {
        local_2c = (((uint)puVar3[uVar8 - 1] * 0x800 + (uint)puVar3[uVar4] * 8 & 0x1f00) +
                   (((uint)puVar3[uVar8 - 1] << 0xe | (uint)puVar3[uVar4]) & 0x1f001f)) - 0x1000000;
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     iVar1,&local_2c);
        }
        else {
          *iVar1._M_current = local_2c;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar4 = (ulong)uVar8;
        puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar8 = uVar8 + 2;
      } while (uVar4 < (ulong)((long)(colors->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3));
    }
    break;
  case gb:
    if ((long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start == 1) {
      iVar6 = 0;
      switch(*(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start & 3) {
      case 1:
        goto switchD_00147ea0_caseD_1;
      case 2:
        goto switchD_00147ea0_caseD_2;
      case 3:
        goto switchD_00147ea0_caseD_3;
      }
switchD_00147ea0_caseD_0:
      local_2c = 0xff030303;
      do {
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     iVar1,&local_2c);
        }
        else {
          *iVar1._M_current = local_2c;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar6 = iVar6 + 2;
        if (iVar6 == 8) {
          return __return_storage_ptr__;
        }
        switch(*(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start >> ((byte)iVar6 & 0x1f) & 3) {
        case 0:
          goto switchD_00147ea0_caseD_0;
        case 1:
switchD_00147ea0_caseD_1:
          local_2c = 0xff020202;
          break;
        case 2:
switchD_00147ea0_caseD_2:
          local_2c = 0xff010101;
          break;
        case 3:
switchD_00147ea0_caseD_3:
          local_2c = 0xff000000;
        }
      } while( true );
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"native palette size not one byte");
LAB_001480ce:
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case md:
    if ((*(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
      goto LAB_001480ce;
    }
    puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      uVar8 = 2;
      uVar4 = 0;
      do {
        local_2c = ((uint)puVar3[uVar8 - 1] * 0x8000 + (uint)puVar3[uVar4] * 8 |
                   (uint)(puVar3[uVar4] >> 1)) & 0x70707 | 0xff000000;
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     iVar1,&local_2c);
        }
        else {
          *iVar1._M_current = local_2c;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar4 = (ulong)uVar8;
        puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar8 = uVar8 + 2;
      } while (uVar4 < (ulong)((long)(colors->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3));
    }
    break;
  case pce:
  case pce_sprite:
    if ((*(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
      goto LAB_001480ce;
    }
    puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      uVar8 = 2;
      uVar4 = 0;
      do {
        local_2c = ((uint)puVar3[uVar4] << 8 | (uint)puVar3[uVar8 - 1] << 0x12 |
                   (uint)(puVar3[uVar4] >> 3)) & 0x700707 | 0xff000000;
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     iVar1,&local_2c);
        }
        else {
          *iVar1._M_current = local_2c;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar4 = (ulong)uVar8;
        puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar8 = uVar8 + 2;
      } while (uVar4 < (ulong)((long)(colors->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3));
    }
    break;
  case ws:
    if ((long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start != 2) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not two bytes");
      goto LAB_001480ce;
    }
    bVar5 = 0;
    uVar8 = 0;
    do {
      local_2c = (~(uint)((colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar8 >> 1] >> (bVar5 & 4)) & 7
                 ) * 0x10101 | 0xff000000;
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,iVar1
                   ,&local_2c);
      }
      else {
        *iVar1._M_current = local_2c;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      uVar8 = uVar8 + 1;
      bVar5 = bVar5 + 4;
    } while (uVar8 != 4);
    break;
  case wsc:
  case wsc_packed:
    if ((*(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
      goto LAB_001480ce;
    }
    puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      uVar8 = 2;
      uVar4 = 0;
      do {
        local_2c = ((uint)puVar3[uVar4] << 0x10 | (uint)puVar3[uVar4] << 4 | (uint)puVar3[uVar8 - 1]
                   ) & 0xf0f0f | 0xff000000;
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     iVar1,&local_2c);
        }
        else {
          *iVar1._M_current = local_2c;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar4 = (ulong)uVar8;
        puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar8 = uVar8 + 2;
      } while (uVar4 < (ulong)((long)(colors->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3));
    }
    break;
  case ngp:
    if ((long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start != 4) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not four bytes");
      goto LAB_001480ce;
    }
    lVar9 = 0;
    do {
      local_2c = (~(uint)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start[lVar9] & 7) * 0x10101 |
                 0xff000000;
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,iVar1
                   ,&local_2c);
      }
      else {
        *iVar1._M_current = local_2c;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    break;
  case ngpc:
    if ((*(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
      goto LAB_001480ce;
    }
    puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      uVar8 = 2;
      uVar4 = 0;
      do {
        local_2c = ((uint)puVar3[uVar4] << 4 | (uint)puVar3[uVar8 - 1] << 0x10 | (uint)puVar3[uVar4]
                   ) & 0xf0f0f | 0xff000000;
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     iVar1,&local_2c);
        }
        else {
          *iVar1._M_current = local_2c;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar4 = (ulong)uVar8;
        puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar8 = uVar8 + 2;
      } while (uVar4 < (ulong)((long)(colors->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3));
    }
    break;
  case sms:
    puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      uVar4 = 0;
      uVar7 = 1;
      do {
        bVar5 = puVar3[uVar4];
        local_2c = ((bVar5 & 0x30) * 0x1000 + ((bVar5 & 0xc) << 6 | bVar5 & 3)) - 0x1000000;
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     iVar1,&local_2c);
        }
        else {
          *iVar1._M_current = local_2c;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        bVar2 = uVar7 < (ulong)((long)(colors->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
        uVar4 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar2);
    }
    break;
  case gg:
    if ((*(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
      goto LAB_001480ce;
    }
    puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      uVar8 = 2;
      uVar4 = 0;
      do {
        local_2c = ((uint)puVar3[uVar4] << 4 | (uint)puVar3[uVar8 - 1] << 0x10 | (uint)puVar3[uVar4]
                   ) & 0xf0f0f | 0xff000000;
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     iVar1,&local_2c);
        }
        else {
          *iVar1._M_current = local_2c;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar4 = (ulong)uVar8;
        puVar3 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar8 = uVar8 + 2;
      } while (uVar4 < (ulong)((long)(colors->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline rgba_vec_t unpack_native_colors(const byte_vec_t& colors, Mode mode) {
  rgba_vec_t v;
  switch (mode) {
  case Mode::snes:
  case Mode::snes_mode7:
  case Mode::gbc:
  case Mode::gba:
  case Mode::gba_affine:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = (cw & 0x001f) | ((cw & 0x03e0) << 3) | ((cw & 0x7c00) << 6) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::sms:
    for (unsigned i = 0; i < colors.size(); i++) {
      rgba_t nc = (colors[i] & 3) | ((colors[i] & 0xC) << 6) | ((colors[i] & 0x30) << 12) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::gb:
    if (colors.size() != 1) {
      throw std::runtime_error("native palette size not one byte");
    }
    for (unsigned i = 0; i < 4; ++i) {
      rgba_t rgba;
      switch ((colors[0] >> (i * 2)) & 0x3) {
        case 0: rgba = 0xff030303; break;
        case 1: rgba = 0xff020202; break;
        case 2: rgba = 0xff010101; break;
        case 3: rgba = 0xff000000; break;
        default:
          rgba = 0;
      }
      v.push_back(rgba);
    }
    break;
  case Mode::gg:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = (cw & 0x00f) | ((cw & 0x00f0) << 4) | ((cw & 0x0f00) << 8) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::md:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = ((cw & 0x00e) >> 1) | ((cw & 0x00e0) << 3) | ((cw & 0x0e00) << 7) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::pce:
  case Mode::pce_sprite:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = ((cw & 0x0038) >> 3) | ((cw & 0x0007) << 8) | ((cw & 0x1c00) << 10) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::ws:
    // TODO: WonderSwan technically supports 8 out of 16 gray shades.
    // Currently, we do not support this additional distinction.
    if (colors.size() != 2) {
      throw std::runtime_error("native palette size not two bytes");
    }
    for (unsigned i = 0; i < 4; ++i) {
      rgba_t rgba;
      uint32_t c = (colors[i >> 1] >> ((i & 0x01) * 4)) & 0x7;
      rgba = 0xff000000 | ((c ^ 0x7) * 0x10101);
      v.push_back(rgba);
    }
    break;
  case Mode::ngp:
    if (colors.size() != 4) {
      throw std::runtime_error("native palette size not four bytes");
    }
    for (unsigned i = 0; i < 4; ++i) {
      rgba_t rgba;
      uint32_t c = colors[i] & 0x7;
      rgba = 0xff000000 | ((c ^ 0x7) * 0x10101);
      v.push_back(rgba);
    }
    break;
  case Mode::wsc:
  case Mode::wsc_packed:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = 0xff000000 | ((cw & 0xf00) >> 8) | ((cw & 0xf0) << 4) | ((cw & 0xf) << 16);
      v.push_back(nc);
    }
    break;
  case Mode::ngpc:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = 0xff000000 | (cw & 0xf) | ((cw & 0xf0) << 4) | ((cw & 0xf00) << 8);
      v.push_back(nc);
    }
    break;
  case Mode::none:
    break;
  }
  return v;
}